

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSizePromotion.cpp
# Opt level: O0

GLuint gl3cts::TextureSizePromotion::Utilities::buildProgram
                 (Functions *gl,TestLog *log,GLchar *vertex_shader_source,
                 GLchar *fragment_shader_source)

{
  long lVar1;
  GLuint GVar2;
  GLenum GVar3;
  GLuint GVar4;
  MessageBuilder *pMVar5;
  undefined4 *puVar6;
  Enum<int,_2UL> EVar7;
  uint local_3bc;
  undefined1 local_3b8 [4];
  GLuint i_2;
  GLchar *local_238;
  GLchar *log_text_1;
  uint local_228;
  GLint log_size_1;
  GLuint i_1;
  GLint status;
  int local_218;
  Enum<int,_2UL> local_210;
  MessageBuilder local_200;
  GLchar *local_80;
  GLchar *log_text;
  GLint log_size;
  GLint status_1;
  GLuint i;
  undefined4 local_5c;
  GLchar *pGStack_58;
  GLuint shader_count;
  Shader shader [2];
  GLuint program;
  GLchar *fragment_shader_source_local;
  GLchar *vertex_shader_source_local;
  TestLog *log_local;
  Functions *gl_local;
  
  shader[0].source._0_4_ = 0x8b31;
  shader[0].source._4_4_ = 0;
  shader[1].source._0_4_ = 0x8b30;
  shader[1].source._4_4_ = 0;
  local_5c = 2;
  pGStack_58 = vertex_shader_source;
  shader[0]._8_8_ = fragment_shader_source;
  GVar2 = (*gl->createProgram)();
  GVar3 = (*gl->getError)();
  glu::checkError(GVar3,"glCreateProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                  ,0x56d);
  log_size = 0;
  do {
    if (1 < (uint)log_size) {
      (*gl->linkProgram)(GVar2);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glTransformFeedbackVaryings call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                      ,0x5a7);
      log_size_1 = 0;
      (*gl->getProgramiv)(GVar2,0x8b82,&log_size_1);
      if (log_size_1 != 1) {
        log_text_1._4_4_ = 0;
        (*gl->getProgramiv)(GVar2,0x8b84,(GLint *)((long)&log_text_1 + 4));
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glGetProgramiv call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                        ,0x5bf);
        local_238 = (GLchar *)operator_new__((long)log_text_1._4_4_);
        (*gl->getProgramInfoLog)(GVar2,log_text_1._4_4_,(GLsizei *)0x0,local_238);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_3b8,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_3b8,
                            (char (*) [36])"Program linkage has failed due to:\n");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_238);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3b8);
        if (local_238 != (GLchar *)0x0) {
          operator_delete__(local_238);
        }
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glGetProgramInfoLog call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                        ,0x5cb);
        puVar6 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar6 = 0;
        __cxa_throw(puVar6,&int::typeinfo,0);
      }
      for (local_228 = 0; local_228 < 2; local_228 = local_228 + 1) {
        if (*(int *)((long)&shader[local_228].source + 4) != 0) {
          (*gl->detachShader)(GVar2,*(GLuint *)((long)&shader[local_228].source + 4));
          GVar3 = (*gl->getError)();
          glu::checkError(GVar3,"glDetachShader call failed.",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                          ,0x5b5);
        }
      }
      for (local_3bc = 0; local_3bc < 2; local_3bc = local_3bc + 1) {
        if (*(int *)((long)&shader[local_3bc].source + 4) != 0) {
          (*gl->deleteShader)(*(GLuint *)((long)&shader[local_3bc].source + 4));
          *(undefined4 *)((long)&shader[local_3bc].source + 4) = 0;
        }
      }
      return GVar2;
    }
    lVar1._0_4_ = shader[(ulong)(uint)log_size - 1].type;
    lVar1._4_4_ = shader[(ulong)(uint)log_size - 1].id;
    if (lVar1 != 0) {
      GVar4 = (*gl->createShader)(*(GLenum *)&shader[(uint)log_size].source);
      *(GLuint *)((long)&shader[(uint)log_size].source + 4) = GVar4;
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glCreateShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                      ,0x577);
      (*gl->attachShader)(GVar2,*(GLuint *)((long)&shader[(uint)log_size].source + 4));
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glAttachShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                      ,0x57b);
      (*gl->shaderSource)(*(GLuint *)((long)&shader[(uint)log_size].source + 4),1,
                          (GLchar **)&shader[(ulong)(uint)log_size - 1].type,(GLint *)0x0);
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glShaderSource call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                      ,0x57f);
      (*gl->compileShader)(*(GLuint *)((long)&shader[(uint)log_size].source + 4));
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glCompileShader call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                      ,0x583);
      log_text._4_4_ = 0;
      (*gl->getShaderiv)(*(GLuint *)((long)&shader[(uint)log_size].source + 4),0x8b81,
                         (GLint *)((long)&log_text + 4));
      GVar3 = (*gl->getError)();
      glu::checkError(GVar3,"glGetShaderiv call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                      ,0x588);
      if (log_text._4_4_ == 0) {
        log_text._0_4_ = 0;
        (*gl->getShaderiv)(*(GLuint *)((long)&shader[(uint)log_size].source + 4),0x8b84,
                           (GLint *)&log_text);
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glGetShaderiv call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                        ,0x58e);
        local_80 = (GLchar *)operator_new__((long)(int)log_text);
        (*gl->getShaderInfoLog)
                  (*(GLuint *)((long)&shader[(uint)log_size].source + 4),(int)log_text,
                   (GLsizei *)0x0,local_80);
        tcu::TestLog::operator<<(&local_200,log,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_200,(char (*) [32])"Shader compilation has failed.\n");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [14])"Shader type: ");
        EVar7 = glu::getShaderTypeStr(*(int *)&shader[(uint)log_size].source);
        _i_1 = EVar7.m_getName;
        local_218 = EVar7.m_value;
        local_210.m_getName = _i_1;
        local_210.m_value = local_218;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_210);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char (*) [31])"Shader compilation error log:\n");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_80);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [21])"Shader source code:\n");
        pMVar5 = tcu::MessageBuilder::operator<<
                           (pMVar5,(char **)&shader[(ulong)(uint)log_size - 1].type);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x2b8f97b);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_200);
        if (local_80 != (GLchar *)0x0) {
          operator_delete__(local_80);
        }
        GVar3 = (*gl->getError)();
        glu::checkError(GVar3,"glGetShaderInfoLog call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSizePromotion.cpp"
                        ,0x59e);
        puVar6 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar6 = 0;
        __cxa_throw(puVar6,&int::typeinfo,0);
      }
    }
    log_size = log_size + 1;
  } while( true );
}

Assistant:

glw::GLuint buildProgram(glw::Functions const& gl, tcu::TestLog& log, glw::GLchar const* const vertex_shader_source,
						 glw::GLchar const* const fragment_shader_source)
{
	glw::GLuint program = 0;

	struct Shader
	{
		glw::GLchar const* const source;
		glw::GLenum const		 type;
		glw::GLuint				 id;
	} shader[] = { { vertex_shader_source, GL_VERTEX_SHADER, 0 }, { fragment_shader_source, GL_FRAGMENT_SHADER, 0 } };

	glw::GLuint const shader_count = sizeof(shader) / sizeof(shader[0]);

	try
	{
		/* Create program. */
		program = gl.createProgram();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram call failed.");

		/* Shader compilation. */

		for (glw::GLuint i = 0; i < shader_count; ++i)
		{
			if (DE_NULL != shader[i].source)
			{
				shader[i].id = gl.createShader(shader[i].type);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader call failed.");

				gl.attachShader(program, shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader call failed.");

				gl.shaderSource(shader[i].id, 1, &(shader[i].source), NULL);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource call failed.");

				gl.compileShader(shader[i].id);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader call failed.");

				glw::GLint status = GL_FALSE;

				gl.getShaderiv(shader[i].id, GL_COMPILE_STATUS, &status);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

				if (GL_FALSE == status)
				{
					glw::GLint log_size = 0;
					gl.getShaderiv(shader[i].id, GL_INFO_LOG_LENGTH, &log_size);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv call failed.");

					glw::GLchar* log_text = new glw::GLchar[log_size];

					gl.getShaderInfoLog(shader[i].id, log_size, NULL, &log_text[0]);

					log << tcu::TestLog::Message << "Shader compilation has failed.\n"
						<< "Shader type: " << glu::getShaderTypeStr(shader[i].type) << "\n"
						<< "Shader compilation error log:\n"
						<< log_text << "\n"
						<< "Shader source code:\n"
						<< shader[i].source << "\n"
						<< tcu::TestLog::EndMessage;

					delete[] log_text;

					GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderInfoLog call failed.");

					throw 0;
				}
			}
		}

		/* Link. */
		gl.linkProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings call failed.");

		glw::GLint status = GL_FALSE;

		gl.getProgramiv(program, GL_LINK_STATUS, &status);

		if (GL_TRUE == status)
		{
			for (glw::GLuint i = 0; i < shader_count; ++i)
			{
				if (shader[i].id)
				{
					gl.detachShader(program, shader[i].id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "glDetachShader call failed.");
				}
			}
		}
		else
		{
			glw::GLint log_size = 0;

			gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &log_size);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv call failed.");

			glw::GLchar* log_text = new glw::GLchar[log_size];

			gl.getProgramInfoLog(program, log_size, NULL, &log_text[0]);

			log << tcu::TestLog::Message << "Program linkage has failed due to:\n"
				<< log_text << "\n"
				<< tcu::TestLog::EndMessage;

			delete[] log_text;

			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramInfoLog call failed.");

			throw 0;
		}
	}
	catch (...)
	{
		if (program)
		{
			gl.deleteProgram(program);

			program = 0;
		}
	}

	for (glw::GLuint i = 0; i < shader_count; ++i)
	{
		if (0 != shader[i].id)
		{
			gl.deleteShader(shader[i].id);

			shader[i].id = 0;
		}
	}

	return program;
}